

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testUpdatablePipelineWithNonUpdatableModels(void)

{
  bool bVar1;
  Pipeline *pPVar2;
  Model *m;
  Model *m_00;
  Model *m_01;
  Model *m_02;
  ostream *poVar3;
  ostream *this;
  RepeatedPtrField<CoreML::Specification::Model> *this_00;
  int iVar4;
  char *pcVar5;
  undefined1 local_f8 [40];
  Result res;
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesB;
  TensorAttributes tensorAttributesA;
  Model spec;
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesA.name = "A";
  tensorAttributesA.dimension = 3;
  tensorAttributesA._12_4_ = 0;
  tensorAttributesB.name = "B";
  tensorAttributesB.dimension = 1;
  tensorAttributesB._12_4_ = 0;
  tensorAttributesC.name = "C";
  tensorAttributesC.dimension = 1;
  tensorAttributesC._12_4_ = 0;
  tensorAttributesD.name = "D";
  tensorAttributesD.dimension = 3;
  tensorAttributesD._12_4_ = 0;
  pPVar2 = buildEmptyPipelineModelWithStringOutput(&spec,true,&tensorAttributesA,"E");
  this_00 = &pPVar2->models_;
  m = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this_00);
  m_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this_00);
  m_01 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this_00);
  m_02 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(this_00);
  buildBasicNeuralNetworkModel(m,false,&tensorAttributesA,&tensorAttributesB,1,false,false);
  buildBasicNeuralNetworkModel(m_00,false,&tensorAttributesB,&tensorAttributesC,1,false,false);
  buildBasicNeuralNetworkModel(m_01,false,&tensorAttributesC,&tensorAttributesD,1,false,false);
  buildBasicNearestNeighborClassifier(m_02,false,&tensorAttributesD,"E");
  CoreML::Model::validate((Result *)local_f8,m);
  CoreML::Result::operator=(&res,(Result *)local_f8);
  std::__cxx11::string::~string((string *)(local_f8 + 8));
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    CoreML::Model::validate((Result *)local_f8,m_00);
    CoreML::Result::operator=(&res,(Result *)local_f8);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      this = (ostream *)std::operator<<(poVar3,":");
      iVar4 = 0x4b2;
      goto LAB_001615d8;
    }
    CoreML::Model::validate((Result *)local_f8,m_01);
    CoreML::Result::operator=(&res,(Result *)local_f8);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      this = (ostream *)std::operator<<(poVar3,":");
      iVar4 = 0x4b5;
      goto LAB_001615d8;
    }
    CoreML::Model::validate((Result *)local_f8,m_02);
    CoreML::Result::operator=(&res,(Result *)local_f8);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      this = (ostream *)std::operator<<(poVar3,":");
      iVar4 = 0x4b8;
      goto LAB_001615d8;
    }
    CoreML::Model::validate((Result *)local_f8,&spec);
    CoreML::Result::operator=(&res,(Result *)local_f8);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    bVar1 = CoreML::Result::good(&res);
    iVar4 = 0;
    if (!bVar1) goto LAB_00161617;
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x4bc);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar5 = "!((res).good())";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    this = (ostream *)std::operator<<(poVar3,":");
    iVar4 = 0x4af;
LAB_001615d8:
    poVar3 = (ostream *)std::ostream::operator<<(this,iVar4);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar5 = "(res).good()";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar4 = 1;
LAB_00161617:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return iVar4;
}

Assistant:

int testUpdatablePipelineWithNonUpdatableModels() {

    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline = buildEmptyPipelineModelWithStringOutput(spec, true, &tensorAttributesA, "E");

    auto m1 = pipeline->add_models();
    auto m2 = pipeline->add_models();
    auto m3 = pipeline->add_models();
    auto m4 = pipeline->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    (void)buildBasicNeuralNetworkModel(*m2, false, &tensorAttributesB, &tensorAttributesC);
    (void)buildBasicNeuralNetworkModel(*m3, false, &tensorAttributesC, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m4, false, &tensorAttributesD, "E");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    // expect validation to fail due to missing updatable model in pipeline.
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    return 0;
}